

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_uint32_iterator_t * roaring_iterator_create(roaring_bitmap_t *r)

{
  roaring_bitmap_t *in_RDI;
  roaring_uint32_iterator_t *newit;
  undefined8 local_8;
  
  local_8 = (roaring_uint32_iterator_t *)roaring_malloc(0x1373f3);
  if (local_8 == (roaring_uint32_iterator_t *)0x0) {
    local_8 = (roaring_uint32_iterator_t *)0x0;
  }
  else {
    roaring_iterator_init(in_RDI,local_8);
  }
  return local_8;
}

Assistant:

roaring_uint32_iterator_t *roaring_iterator_create(const roaring_bitmap_t *r) {
    roaring_uint32_iterator_t *newit =
        (roaring_uint32_iterator_t *)roaring_malloc(
            sizeof(roaring_uint32_iterator_t));
    if (newit == NULL) return NULL;
    roaring_iterator_init(r, newit);
    return newit;
}